

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_scan.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1dca6::
ARTScanTest_scanRangeReverseTwoLeaves_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTScanTest_scanRangeReverseTwoLeaves_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  undefined8 uVar1;
  int iVar2;
  void *extraout_RDX;
  void *pvVar3;
  void *extraout_RDX_00;
  char *pcVar4;
  value_view v;
  value_view v_00;
  key_view kVar5;
  bool match;
  uint64_t n;
  art_key_type to_key_;
  art_key_type from_key_;
  iterator it;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  bool local_6c1;
  AssertHelper local_6c0;
  undefined1 local_6b8 [24];
  vector<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
  local_6a0;
  _Elt_pointer local_680;
  _Elt_pointer local_678;
  undefined1 local_670 [8];
  _Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
  local_668 [4];
  byte *local_518;
  ulong local_510;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(&local_500,false);
  v._M_extent._M_extent_value = 1;
  v._M_ptr = &unodb::test::test_value_1;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal(&local_500,1,v,false);
  v_00._M_extent._M_extent_value = 2;
  v_00._M_ptr = (pointer)&unodb::test::test_value_2;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal(&local_500,2,v_00,false);
  local_6b8._16_8_ = 0;
  local_6a0.
  super__Vector_base<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6a0.
  super__Vector_base<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a0.
  super__Vector_base<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_678 = (_Elt_pointer)0x200000000000000;
  local_680 = (_Elt_pointer)0x0;
  local_6c1 = false;
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  iterator((iterator *)local_670,&local_500.test_db);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
            ((iterator *)local_670,(art_key_type)0x200000000000000,&local_6c1,false);
  pvVar3 = extraout_RDX;
  while ((local_668[0]._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_668[0]._M_impl.super__Deque_impl_data._M_start._M_cur &&
         (iVar2 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                  ::iterator::cmp((iterator *)local_670,&local_680,pvVar3), 0 < iVar2))) {
    local_6b8._16_8_ = local_6b8._16_8_ + 1;
    kVar5 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
            iterator::get_key((iterator *)local_670);
    uVar1 = *(undefined8 *)kVar5._M_ptr;
    local_6c0.data_ =
         (AssertHelperData *)
         ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
          (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
          (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
         uVar1 << 0x38);
    unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
    get_val((iterator *)local_6b8);
    std::
    vector<std::pair<unsigned_long,unodb::qsbr_ptr_span<std::byte_const>>,std::allocator<std::pair<unsigned_long,unodb::qsbr_ptr_span<std::byte_const>>>>
    ::emplace_back<unsigned_long,unodb::qsbr_ptr_span<std::byte_const>>
              ((vector<std::pair<unsigned_long,unodb::qsbr_ptr_span<std::byte_const>>,std::allocator<std::pair<unsigned_long,unodb::qsbr_ptr_span<std::byte_const>>>>
                *)&local_6a0,(unsigned_long *)&local_6c0,(qsbr_ptr_span<const_std::byte> *)local_6b8
              );
    unodb::detail::qsbr_ptr_base::unregister_active_ptr((void *)local_6b8._0_8_);
    unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
    prior((iterator *)local_670);
    pvVar3 = extraout_RDX_00;
  }
  if (0x100 < local_510) {
    free(local_518);
  }
  std::
  _Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
  ::~_Deque_base(local_668);
  local_6b8._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_670,"(2)","(n)",(int *)local_6b8,(unsigned_long *)(local_6b8 + 0x10))
  ;
  if (local_670[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_6b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_668[0]._M_impl.super__Deque_impl_data._M_map ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)local_668[0]._M_impl.super__Deque_impl_data._M_map)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0x2cd,pcVar4);
    testing::internal::AssertHelper::operator=(&local_6c0,(Message *)local_6b8);
    testing::internal::AssertHelper::~AssertHelper(&local_6c0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_6b8._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_668[0]._M_impl.super__Deque_impl_data._M_map !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_668,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_668[0]._M_impl.super__Deque_impl_data._M_map);
  }
  local_6c0.data_._0_4_ = 2;
  local_6b8._0_8_ =
       ((long)local_6a0.
              super__Vector_base<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_6a0.
              super__Vector_base<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_670,"(2)","(visited.size())",(int *)&local_6c0,
             (unsigned_long *)local_6b8);
  if (local_670[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_6b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_668[0]._M_impl.super__Deque_impl_data._M_map ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)local_668[0]._M_impl.super__Deque_impl_data._M_map)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0x2ce,pcVar4);
    testing::internal::AssertHelper::operator=(&local_6c0,(Message *)local_6b8);
    testing::internal::AssertHelper::~AssertHelper(&local_6c0);
    if ((olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
        local_6b8._0_8_ !=
        (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)0x0) {
      (**(code **)(*(long *)local_6b8._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_668[0]._M_impl.super__Deque_impl_data._M_map !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_668,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_668[0]._M_impl.super__Deque_impl_data._M_map);
  }
  local_6b8._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_670,"(2)","(visited[0].first)",(int *)local_6b8,
             &(local_6a0.
               super__Vector_base<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first);
  if (local_670[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_6b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_668[0]._M_impl.super__Deque_impl_data._M_map ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)local_668[0]._M_impl.super__Deque_impl_data._M_map)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0x2cf,pcVar4);
    testing::internal::AssertHelper::operator=(&local_6c0,(Message *)local_6b8);
    testing::internal::AssertHelper::~AssertHelper(&local_6c0);
    if ((olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
        local_6b8._0_8_ !=
        (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)0x0) {
      (**(code **)(*(long *)local_6b8._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_668[0]._M_impl.super__Deque_impl_data._M_map !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_668,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_668[0]._M_impl.super__Deque_impl_data._M_map);
  }
  local_6b8._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_670,"(1)","(visited[1].first)",(int *)local_6b8,
             (version_tag_type *)
             ((long)local_6a0.
                    super__Vector_base<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x18));
  if (local_670[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_6b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_668[0]._M_impl.super__Deque_impl_data._M_map ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)local_668[0]._M_impl.super__Deque_impl_data._M_map)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0x2d0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_6c0,(Message *)local_6b8);
    testing::internal::AssertHelper::~AssertHelper(&local_6c0);
    if ((olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
        local_6b8._0_8_ !=
        (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)0x0) {
      (**(code **)(*(long *)local_6b8._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_668[0]._M_impl.super__Deque_impl_data._M_map !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_668,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_668[0]._M_impl.super__Deque_impl_data._M_map);
  }
  std::
  vector<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>,_std::allocator<std::pair<unsigned_long,_unodb::qsbr_ptr_span<const_std::byte>_>_>_>
  ::~vector(&local_6a0);
  if (local_500.key_views.
      super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_500.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_500.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_500.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~_Rb_tree(&local_500.values._M_t);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::~olc_db
            (&local_500.test_db);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTScanTest, scanRangeReverseTwoLeaves) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(1, unodb::test::test_values[0]);
  verifier.insert(2, unodb::test::test_values[1]);
  uint64_t n = 0;
  std::vector<std::pair<std::uint64_t, typename TypeParam::value_view>>
      visited{};
  auto fn = [&n,
             &visited](const unodb::visitor<typename TypeParam::iterator>& v) {
    n++;
    visited.emplace_back(decode(v.get_key()), v.get_value());
    return false;
  };
  db.scan_range(2, 0, fn);
  UNODB_EXPECT_EQ(2, n);
  UNODB_EXPECT_EQ(2, visited.size());
  UNODB_EXPECT_EQ(2, visited[0].first);  // make sure visited in reverse order.
  UNODB_EXPECT_EQ(1, visited[1].first);
}